

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2.hpp
# Opt level: O2

void crypto::hmac<crypto::iterated_hash<crypto::sha256_transform>_>::prepare_state
               (char *password,size_t length,hash_word *istate,hash_word *ostate)

{
  size_t i;
  long lVar1;
  char ikey [64];
  char okey [64];
  
  if (length < 0x41) {
    memcpy(ikey,password,length);
  }
  else {
    iterated_hash<crypto::sha256_transform>::init
              ((iterated_hash<crypto::sha256_transform> *)okey,(EVP_PKEY_CTX *)length);
    iterated_hash<crypto::sha256_transform>::update
              ((iterated_hash<crypto::sha256_transform> *)okey,password,length);
    iterated_hash<crypto::sha256_transform>::finalize
              ((iterated_hash<crypto::sha256_transform> *)okey,ikey);
    length = 0x20;
  }
  memset(ikey + length,0,0x40 - length);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    okey[lVar1] = ikey[lVar1] ^ 0x5c;
    ikey[lVar1] = ikey[lVar1] ^ 0x36;
  }
  iterated_hash<crypto::sha256_transform>::prepare_state(ikey,1,istate);
  iterated_hash<crypto::sha256_transform>::prepare_state(okey,1,ostate);
  return;
}

Assistant:

static void prepare_state(const char * password, size_t length, state_t istate, state_t ostate) {
		
		char ikey[block_size], okey[block_size];
		if(length > block_size) {
			T hash;
			hash.init();
			hash.update(password, length);
			hash.finalize(ikey);
			length = hash_size;
		} else {
			std::memcpy(ikey, password, length);
		}
		std::memset(ikey + length, 0, block_size - length);
		
		for(size_t i = 0; i < block_size; i++) {
			okey[i] = char(boost::uint8_t(ikey[i]) ^ boost::uint8_t(0x5c));
			ikey[i] = char(boost::uint8_t(ikey[i]) ^ boost::uint8_t(0x36));
		}
		
		T::prepare_state(ikey, 1, istate);
		T::prepare_state(okey, 1, ostate);
		
	}